

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapecube.cpp
# Opt level: O0

void pzshape::TPZShapeCube::ProjectPoint3dCubeToRib
               (int side,TPZVec<Fad<double>_> *in,FADREAL *outval)

{
  Fad<double> *this;
  Fad<double> *this_00;
  TPZVec<Fad<double>_> *in_RSI;
  int in_EDI;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  *fadexpr;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *in_stack_ffffffffffffff60;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *in_stack_ffffffffffffff68;
  Fad<double> *in_stack_ffffffffffffff70;
  double in_stack_ffffffffffffff78;
  
  TPZVec<Fad<double>_>::operator[](in_RSI,0);
  operator*<double,_Fad<double>,_nullptr>(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  fadexpr = *(FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              **)(gRibTrans3dCube1d + (long)in_EDI * 0x18 + 8);
  this = TPZVec<Fad<double>_>::operator[](in_RSI,1);
  operator*<double,_Fad<double>,_nullptr>(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  operator+<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_nullptr>
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  this_00 = TPZVec<Fad<double>_>::operator[](in_RSI,2);
  operator*<double,_Fad<double>,_nullptr>(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  operator+<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  Fad<double>::operator=(this,fadexpr);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)this_00);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)this_00);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)this_00);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)this_00);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)this_00);
  return;
}

Assistant:

void TPZShapeCube::ProjectPoint3dCubeToRib(int side, TPZVec<FADREAL> &in, FADREAL &outval)
	{
		outval = gRibTrans3dCube1d[side][0]*in[0]+gRibTrans3dCube1d[side][1]*in[1]+gRibTrans3dCube1d[side][2]*in[2];
	}